

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O0

void __thiscall curlpp::FormParts::File::~File(File *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__File_00162ba8;
  std::__cxx11::string::~string((string *)(in_RDI + 9));
  std::__cxx11::string::~string((string *)(in_RDI + 5));
  FormPart::~FormPart((FormPart *)0x14c062);
  return;
}

Assistant:

curlpp::FormParts::File::~File()
{}